

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::ScreenshotDirect(CGraphics_Threaded *this,char *pFilename)

{
  void *user_pointer;
  undefined8 in_RSI;
  png_t *in_RDI;
  long in_FS_OFFSET;
  IOHANDLE File;
  png_t Png;
  CScreenshotCommand Cmd;
  CImageInfo Image;
  char aBuf [544];
  char aWholePath [512];
  undefined8 in_stack_fffffffffffffb28;
  CGraphics_Threaded *in_stack_fffffffffffffb30;
  png_t *png;
  png_t local_4a8;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined4 local_44c;
  undefined1 *local_448;
  undefined1 local_440 [16];
  long local_430;
  undefined1 local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  png = in_RDI;
  mem_zero(in_stack_fffffffffffffb30,(uint)((ulong)in_stack_fffffffffffffb28 >> 0x20));
  CCommandBuffer::CScreenshotCommand::CScreenshotCommand((CScreenshotCommand *)0x12f2fc);
  local_448 = local_440;
  local_458 = 0;
  local_454 = 0;
  local_450 = 0xffffffff;
  local_44c = 0xffffffff;
  CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>
            ((CCommandBuffer *)in_RDI,(CScreenshotCommand *)in_stack_fffffffffffffb30);
  KickCommandBuffer(in_stack_fffffffffffffb30);
  (**(code **)(((CBuffer *)&in_RDI->zs)->m_pData + 0x150))();
  if (local_430 != 0) {
    user_pointer = (void *)(**(code **)(*(long *)in_RDI[2].read_fun + 0x20))
                                     ((CCommand *)in_RDI[2].read_fun,in_RSI,2,0,local_208,0x200,0,0)
    ;
    if (user_pointer == (void *)0x0) {
      str_format(&stack0xfffffffffffffbd8,0x220,"failed to open file \'%s\'",in_RSI);
    }
    else {
      png_open_write(&local_4a8,(png_write_callback_t)0x0,user_pointer);
      png_set_data(png,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,
                   (char)((ulong)user_pointer >> 0x38),(int)user_pointer,(uchar *)in_RDI);
      io_close((IOHANDLE)0x12f407);
      str_format(&stack0xfffffffffffffbd8,0x220,"saved screenshot to \'%s\'",local_208);
    }
    (**(code **)(*in_RDI[2].user_pointer + 200))
              (in_RDI[2].user_pointer,0,"client/screenshot",&stack0xfffffffffffffbd8);
    mem_free((void *)0x12f483);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::ScreenshotDirect(const char *pFilename)
{
	// add swap command
	CImageInfo Image;
	mem_zero(&Image, sizeof(Image));

	CCommandBuffer::CScreenshotCommand Cmd;
	Cmd.m_pImage = &Image;
	Cmd.m_X = 0; Cmd.m_Y = 0;
	Cmd.m_W = -1; Cmd.m_H = -1;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the buffer and wait for the result
	KickCommandBuffer();
	WaitForIdle();

	if(Image.m_pData)
	{
		// find filename
		char aWholePath[IO_MAX_PATH_LENGTH];
		char aBuf[IO_MAX_PATH_LENGTH+32];
		IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE, aWholePath, sizeof(aWholePath));
		if(File)
		{
			// save png
			png_t Png; // ignore_convention
			png_open_write(&Png, 0, File); // ignore_convention
			png_set_data(&Png, Image.m_Width, Image.m_Height, 8, PNG_TRUECOLOR, (unsigned char *)Image.m_pData); // ignore_convention
			io_close(File);
			str_format(aBuf, sizeof(aBuf), "saved screenshot to '%s'", aWholePath);
		}
		else
		{
			str_format(aBuf, sizeof(aBuf), "failed to open file '%s'", pFilename);
		}
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client/screenshot", aBuf);
		mem_free(Image.m_pData);
	}
}